

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall toml::detail::region::as_lines_abi_cxx11_(region *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_02;
  const_iterator end_00;
  const_iterator end_01;
  const_iterator end_02;
  size_t sVar1;
  size_t sVar2;
  region *in_RSI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDI;
  pair<const_char_*,_int> pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  last_line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  first_line;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_line_begin;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_line_end;
  char_type lf;
  const_iterator capped_file_begin;
  const_iterator capped_file_end;
  difference_type before_end;
  difference_type after_begin;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin;
  difference_type end_idx;
  difference_type begin_idx;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_stack_fffffffffffffb50;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb58;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb68;
  pair<const_char_*,_unsigned_long> *in_stack_fffffffffffffb78;
  undefined8 **ppuVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_stack_fffffffffffffb80;
  undefined8 **ppuVar5;
  iterator in_stack_fffffffffffffb88;
  size_type in_stack_fffffffffffffb90;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *paVar6;
  undefined1 **local_418;
  undefined1 **local_3c0;
  undefined1 **local_370;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_331;
  char *local_330;
  int local_328;
  undefined4 local_31c;
  region *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  const_iterator in_stack_fffffffffffffcf8;
  undefined1 *local_300 [15];
  undefined8 *local_288;
  undefined8 local_280;
  undefined4 local_278;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_271;
  undefined8 *local_270;
  undefined1 *local_268 [5];
  undefined1 local_240 [40];
  undefined8 *local_218;
  undefined8 local_210;
  uchar *local_208;
  uchar *local_200;
  uchar *local_1d0;
  uchar *local_1c8;
  uchar *local_198;
  uchar *local_190;
  uchar *local_188;
  uchar *local_180;
  uchar *local_178;
  uchar *local_170;
  undefined1 local_161;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  uchar *local_148;
  uchar *local_140;
  uchar *local_138;
  uchar *local_130;
  uchar *local_128;
  difference_type local_120;
  uchar *local_118;
  uchar *local_110;
  difference_type local_108;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_f9;
  uchar *local_f8;
  uchar *local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0 [5];
  undefined8 *local_b8;
  undefined8 local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  long local_88;
  size_t local_80;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_75 [13];
  undefined8 local_68;
  pair<const_char_*,_unsigned_long> local_60;
  undefined8 *local_50;
  undefined1 *local_48 [5];
  undefined8 *local_20;
  undefined8 local_18;
  
  if (in_RSI->length_ == 0) {
    local_50 = local_48;
    local_68 = 0;
    local_60 = std::make_pair<char_const(&)[1],unsigned_long>
                         ((char (*) [1])in_stack_fffffffffffffb50,
                          (unsigned_long *)in_stack_fffffffffffffb48._M_current);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_*,_unsigned_long,_true>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_20 = local_48;
    local_18 = 1;
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 *)0x38664f);
    __l._M_len = in_stack_fffffffffffffb90;
    __l._M_array = in_stack_fffffffffffffb88;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_fffffffffffffb80,__l,(allocator_type *)in_stack_fffffffffffffb78);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::~allocator(local_75);
    local_370 = (undefined1 **)&local_20;
    do {
      local_370 = local_370 + -5;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x3866b8);
    } while (local_370 != local_48);
  }
  else {
    local_80 = in_RSI->first_;
    local_88 = in_RSI->last_ - 1;
    std::
    __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3867e7);
    local_98 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                  (in_stack_fffffffffffffb48._M_current);
    local_90 = (uchar *)std::
                        next<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  (in_stack_fffffffffffffb48,0x38680c);
    std::
    __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x386821);
    local_a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                  (in_stack_fffffffffffffb48._M_current);
    local_a0 = (uchar *)std::
                        next<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  (in_stack_fffffffffffffb48,0x386846);
    sVar1 = first_line_number(in_RSI);
    sVar2 = last_line_number(in_RSI);
    if (sVar1 == sVar2) {
      local_e8 = local_e0;
      local_f0 = local_90;
      local_f8 = local_a0;
      end_00._M_current._4_4_ = in_stack_fffffffffffffcf4;
      end_00._M_current._0_4_ = in_stack_fffffffffffffcf0;
      take_line_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffcf8,end_00);
      local_b8 = local_e0;
      local_b0 = 1;
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                   *)0x386904);
      __l_00._M_len = in_stack_fffffffffffffb90;
      __l_00._M_array = in_stack_fffffffffffffb88;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)in_stack_fffffffffffffb80,__l_00,(allocator_type *)in_stack_fffffffffffffb78);
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::~allocator(&local_f9);
      local_3c0 = (undefined1 **)&local_b8;
      do {
        local_3c0 = local_3c0 + -5;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)0x38696d);
      } while (local_3c0 != local_e0);
    }
    else {
      local_110 = local_90;
      std::
      __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x386a90);
      local_118 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                     (in_stack_fffffffffffffb48._M_current);
      local_108 = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::
      __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x386aca);
      local_128 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                     (in_stack_fffffffffffffb48._M_current);
      local_130 = local_a0;
      local_120 = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::
      __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x386b14);
      local_138 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                     (in_stack_fffffffffffffb48._M_current);
      std::
      __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x386b31);
      local_140 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                     (in_stack_fffffffffffffb48._M_current);
      if (0x3c < local_108) {
        local_150 = local_90;
        local_148 = (uchar *)std::
                             next<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                       (in_stack_fffffffffffffb48,0x386b72);
        local_138 = local_148;
      }
      if (0x3c < local_120) {
        local_160 = local_a0;
        local_158 = (uchar *)std::
                             prev<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                       (in_stack_fffffffffffffb48,0x386bbb);
        local_140 = local_158;
      }
      local_161 = 10;
      local_178 = local_90;
      local_180 = local_138;
      local_170 = (uchar *)std::
                           find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                                     (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                                      in_stack_fffffffffffffb58._M_current);
      local_190 = local_140;
      local_198 = local_a0;
      local_188 = (uchar *)std::
                           find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                                     (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                                      in_stack_fffffffffffffb58._M_current);
      local_1c8 = local_90;
      local_1d0 = local_170;
      end_01._M_current._4_4_ = in_stack_fffffffffffffcf4;
      end_01._M_current._0_4_ = in_stack_fffffffffffffcf0;
      take_line_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffcf8,end_01);
      local_200 = local_188;
      local_208 = local_a0;
      end_02._M_current._4_4_ = in_stack_fffffffffffffcf4;
      end_02._M_current._0_4_ = in_stack_fffffffffffffcf0;
      take_line_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffcf8,end_02);
      sVar1 = first_line_number(in_RSI);
      sVar2 = last_line_number(in_RSI);
      if (sVar1 + 1 == sVar2) {
        local_270 = local_268;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(in_stack_fffffffffffffb50,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)in_stack_fffffffffffffb48._M_current);
        local_270 = (undefined8 *)local_240;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(in_stack_fffffffffffffb50,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)in_stack_fffffffffffffb48._M_current);
        local_218 = local_268;
        local_210 = 2;
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                     *)0x386da2);
        __l_01._M_len = in_stack_fffffffffffffb90;
        __l_01._M_array = in_stack_fffffffffffffb88;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffb80,__l_01,(allocator_type *)in_stack_fffffffffffffb78);
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::~allocator(&local_271);
        local_418 = (undefined1 **)&local_218;
        do {
          local_418 = local_418 + -5;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   *)0x386e0b);
        } while (local_418 != local_268);
      }
      else {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(in_stack_fffffffffffffb50,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)in_stack_fffffffffffffb48._M_current);
        local_31c = 0;
        pVar3 = std::make_pair<char_const(&)[4],int>
                          ((char (*) [4])in_stack_fffffffffffffb50,
                           (int *)in_stack_fffffffffffffb48._M_current);
        local_330 = pVar3.first;
        local_328 = pVar3.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair<const_char_*,_int,_true>
                  (in_stack_fffffffffffffb80,(pair<const_char_*,_int> *)in_stack_fffffffffffffb78);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(in_stack_fffffffffffffb50,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)in_stack_fffffffffffffb48._M_current);
        local_288 = local_300;
        local_280 = 3;
        paVar6 = &local_331;
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                     *)0x387015);
        __l_02._M_len = (size_type)paVar6;
        __l_02._M_array = in_stack_fffffffffffffb88;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffb80,__l_02,(allocator_type *)in_stack_fffffffffffffb78);
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::~allocator(&local_331);
        ppuVar5 = (undefined8 **)local_300;
        ppuVar4 = &local_288;
        do {
          ppuVar4 = ppuVar4 + -5;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   *)0x38706f);
        } while (ppuVar4 != ppuVar5);
      }
      local_278 = 1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x38715a);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x387167);
    }
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::vector<std::pair<std::string, std::size_t>> region::as_lines() const
{
    assert(this->is_ok());
    if(this->length_ == 0)
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            std::make_pair("", std::size_t(0))
        };
    }

    // Consider the following toml file
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // and the region represnets
    // ```
    //         [
    //   1, 2, 3,
    // ]
    // ```
    // but we want to show the following.
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // So we need to find LFs before `begin` and after `end`.
    //
    // But, if region ends with LF, it should not include the next line.
    // ```
    // a = 42
    //     ^^^- with the last LF
    // ```
    // So we start from `end-1` when looking for LF.

    const auto begin_idx = static_cast<difference_type>(this->first_);
    const auto end_idx   = static_cast<difference_type>(this->last_) - 1;

    // length_ != 0, so begin < end. then begin <= end-1
    assert(begin_idx <= end_idx);

    const auto begin = std::next(this->source_->cbegin(), begin_idx);
    const auto end   = std::next(this->source_->cbegin(), end_idx);

    assert(this->first_line_number() <= this->last_line_number());

    if(this->first_line_number() == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            this->take_line(begin, end)
        };
    }

    // we have multiple lines. `begin` and `end` points different lines.
    // that means that there is at least one `LF` between `begin` and `end`.

    const auto after_begin = std::distance(begin, this->source_->cend());
    const auto before_end  = std::distance(this->source_->cbegin(), end);

    const_iterator capped_file_end   = this->source_->cend();
    const_iterator capped_file_begin = this->source_->cbegin();
    if(60 < after_begin) {capped_file_end   = std::next(begin, 50);}
    if(60 < before_end)  {capped_file_begin = std::prev(end,   50);}

    const auto lf = char_type('\n');
    const auto first_line_end  = std::find(begin, capped_file_end, lf);
    const auto last_line_begin = std::find(capped_file_begin, end, lf);

    const auto first_line = this->take_line(begin, first_line_end);
    const auto last_line  = this->take_line(last_line_begin, end);

    if(this->first_line_number() + 1 == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, last_line
        };
    }
    else
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, std::make_pair("...", 0), last_line
        };
    }
}